

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O1

void __thiscall
burst::
intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>_>_>_>,_std::less<void>_>
::faze(intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>_>_>_>,_std::less<void>_>
       *this)

{
  long *plVar1;
  long *plVar2;
  iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
  *piVar3;
  iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
  *piVar4;
  iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
  *piVar5;
  long *plVar6;
  iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
  __tmp;
  
  piVar3 = (this->m_begin)._M_current;
  piVar4 = piVar3;
  piVar5 = piVar3;
  if ((this->m_end)._M_current != piVar3) {
    do {
      plVar6 = (piVar3->
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_current + 1;
      (piVar3->
      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
      ).
      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin._M_current = plVar6;
      if (plVar6 == (piVar3->
                    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
                    ).
                    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
                    .
                    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                    .m_End._M_current) {
        (this->m_end)._M_current = (this->m_begin)._M_current;
        return;
      }
      plVar1 = (piVar5->
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_current;
      if (plVar1 == (piVar5->
                    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
                    ).
                    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
                    .
                    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                    .m_End._M_current) {
        __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                      "reference boost::iterator_range_detail::iterator_range_base<__gnu_cxx::__normal_iterator<const long *, std::vector<long>>, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = __gnu_cxx::__normal_iterator<const long *, std::vector<long>>, TraversalTag = boost::iterators::incrementable_traversal_tag]"
                     );
      }
      piVar4 = piVar3;
      if (*plVar6 <= *plVar1) {
        piVar4 = piVar5;
      }
      piVar3 = piVar3 + 1;
      piVar5 = piVar4;
    } while (piVar3 != (this->m_end)._M_current);
  }
  piVar3 = (this->m_end)._M_current;
  plVar6 = (piVar4->
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
           ).
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin._M_current;
  plVar1 = (piVar4->
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
           ).
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_End._M_current;
  plVar2 = piVar3[-1].
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_End._M_current;
  (piVar4->
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
  ).
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current =
       piVar3[-1].
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin._M_current;
  (piVar4->
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
  ).
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = plVar2;
  piVar3[-1].
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = plVar6;
  piVar3[-1].
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = plVar1;
  return;
}

Assistant:

void faze ()
        {
            auto max_range = m_begin;
            for (auto range = m_begin; range != m_end; ++range)
            {
                range->advance_begin(1);
                if (range->empty())
                {
                    scroll_to_end();
                    return;
                }
                else if (m_compare(max_range->front(), range->front()))
                {
                    max_range = range;
                }
            }
            std::iter_swap(max_range, std::prev(m_end));
        }